

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O3

int stbi_write_tga(char *filename,int x,int y,int comp,void *data)

{
  int iVar1;
  stbi__write_context local_80;
  
  local_80.buffer[0x30] = '\0';
  local_80.buffer[0x31] = '\0';
  local_80.buffer[0x32] = '\0';
  local_80.buffer[0x33] = '\0';
  local_80.buffer[0x34] = '\0';
  local_80.buffer[0x35] = '\0';
  local_80.buffer[0x36] = '\0';
  local_80.buffer[0x37] = '\0';
  local_80.buffer[0x38] = '\0';
  local_80.buffer[0x39] = '\0';
  local_80.buffer[0x3a] = '\0';
  local_80.buffer[0x3b] = '\0';
  local_80.buffer[0x3c] = '\0';
  local_80.buffer[0x3d] = '\0';
  local_80.buffer[0x3e] = '\0';
  local_80.buffer[0x3f] = '\0';
  local_80.buffer[0x20] = '\0';
  local_80.buffer[0x21] = '\0';
  local_80.buffer[0x22] = '\0';
  local_80.buffer[0x23] = '\0';
  local_80.buffer[0x24] = '\0';
  local_80.buffer[0x25] = '\0';
  local_80.buffer[0x26] = '\0';
  local_80.buffer[0x27] = '\0';
  local_80.buffer[0x28] = '\0';
  local_80.buffer[0x29] = '\0';
  local_80.buffer[0x2a] = '\0';
  local_80.buffer[0x2b] = '\0';
  local_80.buffer[0x2c] = '\0';
  local_80.buffer[0x2d] = '\0';
  local_80.buffer[0x2e] = '\0';
  local_80.buffer[0x2f] = '\0';
  local_80.buffer[0x10] = '\0';
  local_80.buffer[0x11] = '\0';
  local_80.buffer[0x12] = '\0';
  local_80.buffer[0x13] = '\0';
  local_80.buffer[0x14] = '\0';
  local_80.buffer[0x15] = '\0';
  local_80.buffer[0x16] = '\0';
  local_80.buffer[0x17] = '\0';
  local_80.buffer[0x18] = '\0';
  local_80.buffer[0x19] = '\0';
  local_80.buffer[0x1a] = '\0';
  local_80.buffer[0x1b] = '\0';
  local_80.buffer[0x1c] = '\0';
  local_80.buffer[0x1d] = '\0';
  local_80.buffer[0x1e] = '\0';
  local_80.buffer[0x1f] = '\0';
  local_80.buffer[0] = '\0';
  local_80.buffer[1] = '\0';
  local_80.buffer[2] = '\0';
  local_80.buffer[3] = '\0';
  local_80.buffer[4] = '\0';
  local_80.buffer[5] = '\0';
  local_80.buffer[6] = '\0';
  local_80.buffer[7] = '\0';
  local_80.buffer[8] = '\0';
  local_80.buffer[9] = '\0';
  local_80.buffer[10] = '\0';
  local_80.buffer[0xb] = '\0';
  local_80.buffer[0xc] = '\0';
  local_80.buffer[0xd] = '\0';
  local_80.buffer[0xe] = '\0';
  local_80.buffer[0xf] = '\0';
  local_80.buf_used = 0;
  local_80._84_4_ = 0;
  local_80.context = fopen(filename,"wb");
  local_80.func = stbi__stdio_write;
  if ((FILE *)local_80.context == (FILE *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = stbi_write_tga_core(&local_80,x,y,comp,data);
    fclose((FILE *)local_80.context);
  }
  return iVar1;
}

Assistant:

STBIWDEF int stbi_write_tga(char const *filename, int x, int y, int comp, const void *data)
{
   stbi__write_context s = { 0 };
   if (stbi__start_write_file(&s,filename)) {
      int r = stbi_write_tga_core(&s, x, y, comp, (void *) data);
      stbi__end_write_file(&s);
      return r;
   } else
      return 0;
}